

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name.h
# Opt level: O3

DamageTypeDefinition * DamageTypeDefinition::Get(FName *type)

{
  Node *pNVar1;
  DamageTypeDefinition *pDVar2;
  Node *pNVar3;
  
  pNVar1 = GlobalDamageDefinitions.Nodes + (GlobalDamageDefinitions.Size - 1 & type->Index);
  while ((pNVar3 = pNVar1, pNVar3 != (Node *)0x0 && (pNVar3->Next != (Node *)0x1))) {
    pNVar1 = pNVar3->Next;
    if ((pNVar3->Pair).Key.Index == type->Index) {
LAB_0039e4bd:
      pDVar2 = &(pNVar3->Pair).Value;
      if (pNVar3 == (Node *)0x0) {
        pDVar2 = (DamageTypeDefinition *)0x0;
      }
      return pDVar2;
    }
  }
  pNVar3 = (Node *)0x0;
  goto LAB_0039e4bd;
}

Assistant:

FName (const FName &other) { Index = other.Index; }